

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O0

void SL::WS_LITE::
     start_ping<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
               (shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *socket,seconds secs)

{
  bool bVar1;
  rep rVar2;
  element_type *peVar3;
  type_conflict1 local_1f0;
  string local_1c8;
  ostringstream local_1a8 [8];
  ostringstream buffersl134nonesd;
  duration local_30;
  undefined1 local_28 [8];
  error_code ec;
  shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
  *socket_local;
  seconds secs_local;
  
  ec._M_cat = (error_category *)socket;
  socket_local = (shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                  *)secs.__r;
  std::error_code::error_code((error_code *)local_28);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                    ((duration<long,_std::ratio<1L,_1L>_> *)&socket_local);
  if (rVar2 == 0) {
    peVar3 = std::
             __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ec._M_cat);
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
    ::cancel(&peVar3->ping_deadline,(error_code *)local_28);
  }
  peVar3 = std::
           __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)ec._M_cat);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_30,
             (duration<long,_std::ratio<1L,_1L>_> *)&socket_local);
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
  ::expires_from_now(&peVar3->ping_deadline,&local_30,(error_code *)local_28);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_28);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::error_code::message_abi_cxx11_(&local_1c8,(error_code *)local_28);
    std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    Log(ERROR_log_level,
        "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
        ,0x3c,"start_ping",(ostringstream *)local_1a8);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  else {
    rVar2 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                      ((duration<long,_std::ratio<1L,_1L>_> *)&socket_local);
    if (0 < rVar2) {
      peVar3 = std::
               __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)ec._M_cat);
      std::shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>::
      shared_ptr(&local_1f0.socket,
                 (shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                  *)ec._M_cat);
      local_1f0.secs.__r = (rep)socket_local;
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
      ::
      async_wait<SL::WS_LITE::start_ping<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>(std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>const&,std::chrono::duration<long,std::ratio<1l,1l>>)::_lambda(std::error_code_const&)_1_>
                ((basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>
                  *)&peVar3->ping_deadline,&local_1f0);
      start_ping<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>(std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>const&,std::chrono::duration<long,std::ratio<1l,1l>>)
      ::{lambda(std::error_code_const&)#1}::~error_code
                ((_lambda_std__error_code_const___1_ *)&local_1f0);
    }
  }
  return;
}

Assistant:

void start_ping(const SOCKETTYPE &socket, std::chrono::seconds secs)
    {
        std::error_code ec;
        if (secs.count() == 0)
            socket->ping_deadline.cancel(ec);
        socket->ping_deadline.expires_from_now(secs, ec);
        if (ec) {
            SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, ec.message());
        }
        else if (secs.count() > 0) {
            socket->ping_deadline.async_wait([socket, secs](const std::error_code &ec) {
                if (ec != asio::error::operation_aborted) {
                    WSMessage msg;
                    char p[] = "ping";
                    msg.Buffer = std::shared_ptr<unsigned char>(new unsigned char[sizeof(p)], [](unsigned char *ptr) { delete[] ptr; });
                    memcpy(msg.Buffer.get(), p, sizeof(p));
                    msg.len = sizeof(p);
                    msg.code = OpCode::PING;
                    msg.data = msg.Buffer.get();
                    sendImpl<isServer>(socket, msg, CompressionOptions::NO_COMPRESSION);
                    start_ping<isServer>(socket, secs);
                }
            });
        }
    }